

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

void enumerate(MAFSA_automaton ma,uint32_t cstate,MAFSA_stack_struct *out_stack,
              MAFSA_automaton_string_handler fetcher,void *user_data)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((int)cstate < 0) {
    (*fetcher)(user_data,out_stack->buffer,out_stack->current + 1);
  }
  uVar4 = cstate & 0x7fffffff;
  puVar2 = ma->ptr_links + uVar4;
  while( true ) {
    uVar4 = uVar4 + 1;
    uVar1 = *puVar2;
    if (uVar1 == 0xff000000) break;
    uVar3 = out_stack->current + 1;
    if (uVar3 < out_stack->reserved) {
      out_stack->current = uVar3;
      out_stack->buffer[uVar3] = (MAFSA_letter)(uVar1 >> 0x18);
    }
    enumerate(ma,ma->ptr_nodes[uVar1 & 0xffffff],out_stack,fetcher,user_data);
    if (-1 < out_stack->current) {
      out_stack->current = out_stack->current + -1;
    }
    puVar2 = ma->ptr_links + uVar4;
  }
  return;
}

Assistant:

static void enumerate(const MAFSA_automaton ma, const uint32_t cstate, struct MAFSA_stack_struct *out_stack,
    MAFSA_automaton_string_handler fetcher, void *user_data)
{
    uint32_t links_begin, child, where;

    if (node_is_final(cstate))
    {
        fetcher(user_data, out_stack->buffer, stack_size(out_stack));
    }

    links_begin = node_get_children_start(cstate);

    for (child = ma->ptr_links[links_begin]; !link_is_terminating(child); child = ma->ptr_links[++links_begin])
    {
        stack_push(out_stack, link_get_label(child));
        where = link_get_link(child);
        enumerate(ma, ma->ptr_nodes[where], out_stack, fetcher, user_data);
        stack_pop(out_stack);
    }
}